

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

void HeapOp(void)

{
  Chuck *chuck;
  uint8_t uVar1;
  byte bVar2;
  void *raw_00;
  Heap *heap_00;
  Size SVar3;
  Chuck *chuck_00;
  Chuck *chuck_01;
  Chuck *pCVar4;
  ulong local_48;
  Size size;
  Chuck *ck3;
  Chuck *ck2;
  Chuck *ck1;
  Chuck *ck;
  int i;
  uint8_t slot;
  Heap *heap;
  Raw raw;
  
  raw_00 = malloc(0x1000);
  heap_00 = CreateHeap(raw_00,0x1000);
  if (heap_00->head != heap_00->last) {
    __assert_fail("heap->head == heap->last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4d,"void HeapOp()");
  }
  uVar1 = GetUsed(heap_00->head);
  if (uVar1 != '\0') {
    __assert_fail("!GetUsed(heap->head)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4e,"void HeapOp()");
  }
  if (heap_00->head->prev != (ChuckLayout *)0x0) {
    __assert_fail("!heap->head->prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x4f,"void HeapOp()");
  }
  if (heap_00->head->next != (ChuckLayout *)0x0) {
    __assert_fail("!heap->head->next",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x50,"void HeapOp()");
  }
  SVar3 = GetSize(heap_00->head);
  if (SVar3 == 0) {
    __assert_fail("GetSize(heap->head) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x51,"void HeapOp()");
  }
  SVar3 = GetSize(heap_00->head);
  bVar2 = MatchSorted(SVar3);
  for (ck._0_4_ = 0; (int)(uint)ck < 0x40; ck._0_4_ = (uint)ck + 1) {
    if (heap_00->exact[(int)(uint)ck] != (Chuck *)0x0) {
      __assert_fail("!heap->exact[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x55,"void HeapOp()");
    }
    if ((uint)ck == bVar2) {
      if (heap_00->sorted[(int)(uint)ck] != heap_00->head) {
        __assert_fail("heap->sorted[i] == heap->head",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                      ,0x5c,"void HeapOp()");
      }
    }
    else if (heap_00->sorted[(int)(uint)ck] != (Chuck *)0x0) {
      __assert_fail("!heap->sorted[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x58,"void HeapOp()");
    }
  }
  chuck = heap_00->head;
  MoveOut(heap_00,chuck);
  if (heap_00->head != (Chuck *)0x0) {
    __assert_fail("!heap->head",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x62,"void HeapOp()");
  }
  if (heap_00->last != (Chuck *)0x0) {
    __assert_fail("!heap->last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,99,"void HeapOp()");
  }
  MoveIn(heap_00,chuck);
  if (heap_00->head != chuck) {
    __assert_fail("heap->head == ck",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x65,"void HeapOp()");
  }
  if (heap_00->last != chuck) {
    __assert_fail("heap->last == ck",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x66,"void HeapOp()");
  }
  MoveOut(heap_00,chuck);
  chuck_00 = SplitIfWorthy(chuck,0x80);
  chuck_01 = SplitIfWorthy(chuck_00,0x40);
  SplitIfWorthy(chuck_01,0x100);
  MoveIn(heap_00,chuck);
  MoveIn(heap_00,chuck_01);
  if (heap_00->head != chuck) {
    __assert_fail("heap->head == ck1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x6f,"void HeapOp()");
  }
  if (chuck->prev != (ChuckLayout *)0x0) {
    __assert_fail("ck1->prev == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x70,"void HeapOp()");
  }
  if (chuck->next != chuck_01) {
    __assert_fail("ck1->next == ck3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x71,"void HeapOp()");
  }
  if (chuck_01->next != (ChuckLayout *)0x0) {
    __assert_fail("ck3->next == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x72,"void HeapOp()");
  }
  if (heap_00->last != chuck_01) {
    __assert_fail("heap->last == ck3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x73,"void HeapOp()");
  }
  pCVar4 = FindSmallestFitInHeap(heap_00,0);
  if (pCVar4 != chuck) {
    __assert_fail("FindSmallestFitInHeap(heap, 0) == ck1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x74,"void HeapOp()");
  }
  for (local_48 = 0; SVar3 = GetSize(chuck_01), local_48 <= SVar3; local_48 = local_48 + 8) {
    SVar3 = GetSize(chuck);
    if (SVar3 < local_48) {
      pCVar4 = FindSmallestFitInHeap(heap_00,local_48);
      if (pCVar4 != chuck_01) {
        __assert_fail("FindSmallestFitInHeap(heap, size) == ck3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                      ,0x7d,"void HeapOp()");
      }
    }
    else {
      pCVar4 = FindSmallestFitInHeap(heap_00,local_48);
      if (pCVar4 != chuck) {
        __assert_fail("FindSmallestFitInHeap(heap, size) == ck1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                      ,0x79,"void HeapOp()");
      }
    }
  }
  SVar3 = GetSize(chuck_01);
  pCVar4 = FindSmallestFitInHeap(heap_00,SVar3 + 8);
  if (pCVar4 != (Chuck *)0x0) {
    __assert_fail("FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                  ,0x80,"void HeapOp()");
  }
  MoveIn(heap_00,chuck_00);
  if (heap_00->head == chuck_00) {
    if (chuck_00->next != chuck) {
      __assert_fail("ck2->next == ck1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x84,"void HeapOp()");
    }
    MoveOut(heap_00,chuck);
    if (chuck_00->next != chuck_01) {
      __assert_fail("ck2->next == ck3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x86,"void HeapOp()");
    }
    MoveOut(heap_00,chuck_01);
    if (chuck_00->next != (ChuckLayout *)0x0) {
      __assert_fail("ck2->next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x88,"void HeapOp()");
    }
    if (heap_00->last != chuck_00) {
      __assert_fail("heap->last == ck2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                    ,0x89,"void HeapOp()");
    }
    free(raw_00);
    return;
  }
  __assert_fail("heap->head == ck2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Tests/Heap.c"
                ,0x83,"void HeapOp()");
}

Assistant:

void HeapOp()
{
    Raw raw = malloc(sizeof(uint8_t) * 4096);
    Heap *heap = CreateHeap(raw, 4096);

    assert(heap->head == heap->last);
    assert(!GetUsed(heap->head));
    assert(!heap->head->prev);
    assert(!heap->head->next);
    assert(GetSize(heap->head) > 0);
    uint8_t slot = MatchSorted(GetSize(heap->head));
    for (int i = 0; i < 64; i += 1)
    {
        assert(!heap->exact[i]);
        if (i != slot)
        {
            assert(!heap->sorted[i]);
        }
        else
        {
            assert(heap->sorted[i] == heap->head);
        }
    }

    Chuck *ck = heap->head;
    MoveOut(heap, ck);
    assert(!heap->head);
    assert(!heap->last);
    MoveIn(heap, ck);
    assert(heap->head == ck);
    assert(heap->last == ck);

    MoveOut(heap, ck);
    Chuck *ck1 = ck;
    Chuck *ck2 = SplitIfWorthy(ck1, 128);
    Chuck *ck3 = SplitIfWorthy(ck2, 64);
    SplitIfWorthy(ck3, 256);
    MoveIn(heap, ck1);
    MoveIn(heap, ck3);
    assert(heap->head == ck1);
    assert(ck1->prev == NULL);
    assert(ck1->next == ck3);
    assert(ck3->next == NULL);
    assert(heap->last == ck3);
    assert(FindSmallestFitInHeap(heap, 0) == ck1);
    for (Size size = 0; size <= GetSize(ck3); size += 8)
    {
        if (size <= GetSize(ck1))
        {
            assert(FindSmallestFitInHeap(heap, size) == ck1);
        }
        else
        {
            assert(FindSmallestFitInHeap(heap, size) == ck3);
        }
    }
    assert(FindSmallestFitInHeap(heap, GetSize(ck3) + 8) == NULL);

    MoveIn(heap, ck2);
    assert(heap->head == ck2);
    assert(ck2->next == ck1);
    MoveOut(heap, ck1);
    assert(ck2->next == ck3);
    MoveOut(heap, ck3);
    assert(ck2->next == NULL);
    assert(heap->last == ck2);

    free(raw);
}